

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O0

void deMemory_selfTest(void)

{
  deBool dVar1;
  void *pvVar2;
  void *ptr_00;
  ulong local_40;
  ulong local_38;
  size_t off;
  size_t numPreserved;
  void *newPtr;
  void *ptr_1;
  void *ptr;
  int caseNdx;
  
  for (ptr._4_4_ = 0; ptr._4_4_ < 0xb; ptr._4_4_ = ptr._4_4_ + 1) {
    pvVar2 = deAlignedMalloc(deMemory_selfTest::s_alignedAllocCases[ptr._4_4_].numBytes,
                             deMemory_selfTest::s_alignedAllocCases[ptr._4_4_].alignment);
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (pvVar2 == (void *)0x0)) {
        deAssertFail("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x141);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) ||
         (dVar1 = deIsAlignedPtr(pvVar2,deMemory_selfTest::s_alignedAllocCases[ptr._4_4_].alignment)
         , dVar1 == 0)) {
        deAssertFail("deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x142);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    deMemset(pvVar2,0xaa,deMemory_selfTest::s_alignedAllocCases[ptr._4_4_].numBytes);
    deAlignedFree(pvVar2);
  }
  for (ptr._4_4_ = 0; ptr._4_4_ < 0xf; ptr._4_4_ = ptr._4_4_ + 1) {
    pvVar2 = deAlignedMalloc(deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].initialSize,
                             deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].alignment);
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (pvVar2 == (void *)0x0)) {
        deAssertFail("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x14d);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) ||
         (dVar1 = deIsAlignedPtr(pvVar2,deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].
                                        alignment), dVar1 == 0)) {
        deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x14e);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    deMemset(pvVar2,0xaa,deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].initialSize);
    ptr_00 = deAlignedRealloc(pvVar2,deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].newSize,
                              deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].alignment);
    if (deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].newSize <
        deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].initialSize) {
      local_40 = deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].newSize;
    }
    else {
      local_40 = deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].initialSize;
    }
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) || (ptr_00 == (void *)0x0)) {
        deAssertFail("newPtr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x159);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    do {
      dVar1 = deGetFalse();
      if ((dVar1 != 0) ||
         (dVar1 = deIsAlignedPtr(pvVar2,deMemory_selfTest::s_alignedReallocCases[ptr._4_4_].
                                        alignment), dVar1 == 0)) {
        deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x15a);
      }
      dVar1 = deGetFalse();
    } while (dVar1 != 0);
    for (local_38 = 0; local_38 < local_40; local_38 = local_38 + 1) {
      do {
        dVar1 = deGetFalse();
        if ((dVar1 != 0) || (*(char *)((long)ptr_00 + local_38) != -0x56)) {
          deAssertFail("*((const deUint8*)newPtr + off) == 0xaa",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                       ,0x15d);
        }
        dVar1 = deGetFalse();
      } while (dVar1 != 0);
    }
    deAlignedFree(ptr_00);
  }
  return;
}

Assistant:

void deMemory_selfTest (void)
{
	static const struct
	{
		size_t		numBytes;
		size_t		alignment;
	} s_alignedAllocCases[] =
	{
		{ 1,		1		},
		{ 1,		2		},
		{ 1,		256		},
		{ 1,		4096	},
		{ 547389,	1		},
		{ 547389,	2		},
		{ 547389,	256		},
		{ 547389,	4096	},
		{ 52532,	1<<4	},
		{ 52532,	1<<10	},
		{ 52532,	1<<16	},
	};
	static const struct
	{
		size_t		initialSize;
		size_t		newSize;
		size_t		alignment;
	} s_alignedReallocCases[] =
	{
		{ 1,		1,		1		},
		{ 1,		1,		2		},
		{ 1,		1,		256		},
		{ 1,		1,		4096	},
		{ 1,		1241,	1		},
		{ 1,		1241,	2		},
		{ 1,		1241,	256		},
		{ 1,		1241,	4096	},
		{ 547389,	234,	1		},
		{ 547389,	234,	2		},
		{ 547389,	234,	256		},
		{ 547389,	234,	4096	},
		{ 52532,	421523,	1<<4	},
		{ 52532,	421523,	1<<10	},
		{ 52532,	421523,	1<<16	},
	};

	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedAllocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedAllocCases[caseNdx].numBytes, s_alignedAllocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedAllocCases[caseNdx].numBytes);

		deAlignedFree(ptr);
	}

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedReallocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedReallocCases[caseNdx].initialSize, s_alignedReallocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedReallocCases[caseNdx].initialSize);

		{
			void* const		newPtr			= deAlignedRealloc(ptr, s_alignedReallocCases[caseNdx].newSize, s_alignedReallocCases[caseNdx].alignment);
			const size_t	numPreserved	= s_alignedReallocCases[caseNdx].newSize < s_alignedReallocCases[caseNdx].initialSize
											? s_alignedReallocCases[caseNdx].newSize
											: s_alignedReallocCases[caseNdx].initialSize;
			size_t			off;

			DE_TEST_ASSERT(newPtr);
			DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

			for (off = 0; off < numPreserved; off++)
				DE_TEST_ASSERT(*((const deUint8*)newPtr + off) == 0xaa);

			deAlignedFree(newPtr);
		}
	}
}